

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

int Bac_ObjGetRange(Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Bac_NameType_t BVar3;
  int iVar4;
  
  iVar1 = Bac_ObjName(p,iObj);
  iVar2 = Bac_ObjIsCi(p,iObj);
  if (iVar2 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xc6,"int Bac_ObjGetRange(Bac_Ntk_t *, int)");
  }
  BVar3 = Bac_NameType(iVar1);
  if ((BVar3 != BAC_NAME_WORD) && (BVar3 = Bac_NameType(iVar1), BVar3 != BAC_NAME_INFO)) {
    __assert_fail("Bac_NameType(NameId) == BAC_NAME_WORD || Bac_NameType(NameId) == BAC_NAME_INFO",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xc9,"int Bac_ObjGetRange(Bac_Ntk_t *, int)");
  }
  iVar1 = 1;
  while( true ) {
    iVar2 = iVar1;
    iVar1 = iObj + iVar2;
    if ((p->vType).nSize <= iVar1) {
      return iVar2;
    }
    iVar4 = Bac_ObjIsCi(p,iVar1);
    if (iVar4 == 0) break;
    BVar3 = Bac_ObjNameType(p,iVar1);
    iVar1 = iVar2 + 1;
    if (BVar3 != BAC_NAME_INDEX) {
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

static inline int Bac_ObjGetRange( Bac_Ntk_t * p, int iObj )
{
    int i, NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
//    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
//        NameId = Bac_ObjName(p, iObj - Abc_Lit2Var2(NameId));
    assert( Bac_NameType(NameId) == BAC_NAME_WORD || Bac_NameType(NameId) == BAC_NAME_INFO );
    for ( i = iObj + 1; i < Bac_NtkObjNum(p); i++ )
        if ( !Bac_ObjIsCi(p, i) || Bac_ObjNameType(p, i) != BAC_NAME_INDEX )
            break;
    return i - iObj;
}